

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.hxx
# Opt level: O2

void __thiscall
nuraft::srv_config::srv_config
          (srv_config *this,int32 id,int32 dc_id,string *endpoint,string *aux,bool learner,
          int32 priority)

{
  this->id_ = id;
  this->dc_id_ = dc_id;
  std::__cxx11::string::string((string *)&this->endpoint_,(string *)endpoint);
  std::__cxx11::string::string((string *)&this->aux_,(string *)aux);
  this->learner_ = learner;
  this->priority_ = priority;
  return;
}

Assistant:

srv_config(int32 id,
               int32 dc_id,
               const std::string& endpoint,
               const std::string& aux,
               bool learner,
               int32 priority = INIT_PRIORITY)
        : id_(id)
        , dc_id_(dc_id)
        , endpoint_(endpoint)
        , aux_(aux)
        , learner_(learner)
        , priority_(priority)
        {}